

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void readObject(ifstream *stream)

{
  int32_t iVar1;
  mapped_type *pmVar2;
  int local_2c;
  uint i;
  uint32_t subtype_1;
  uint32_t subtype;
  int32_t inventorySize;
  uint32_t id;
  uint32_t type;
  uint32_t PID;
  ifstream *stream_local;
  
  _type = stream;
  readUINT32(stream);
  readINT32(_type);
  readUINT32(_type);
  readUINT32(_type);
  readUINT32(_type);
  readUINT32(_type);
  readUINT32(_type);
  readUINT32(_type);
  readUINT32(_type);
  readUINT32(_type);
  readUINT32(_type);
  id = readUINT32(_type);
  inventorySize = id >> 0x18;
  subtype = id & 0xffffff;
  readUINT32(_type);
  readUINT32(_type);
  readUINT32(_type);
  readUINT32(_type);
  readUINT32(_type);
  readUINT32(_type);
  iVar1 = readINT32(_type);
  readUINT32(_type);
  readUINT32(_type);
  readUINT32(_type);
  switch(inventorySize) {
  case 0:
    pmVar2 = std::
             map<unsigned_int,_char,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_char>_>_>
             ::at(&itemSubtype,&subtype);
    switch(*pmVar2) {
    case '\0':
      break;
    case '\x01':
      break;
    case '\x02':
      break;
    case '\x03':
      readUINT32(_type);
      readUINT32(_type);
      break;
    case '\x04':
      readUINT32(_type);
      break;
    case '\x05':
      readUINT32(_type);
      break;
    case '\x06':
      readUINT32(_type);
    }
    break;
  case 1:
    readUINT32(_type);
    readUINT32(_type);
    readUINT32(_type);
    readUINT32(_type);
    readUINT32(_type);
    readUINT32(_type);
    readUINT32(_type);
    readUINT32(_type);
    readUINT32(_type);
    readUINT32(_type);
    break;
  case 2:
    pmVar2 = std::
             map<unsigned_int,_char,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_char>_>_>
             ::at(&scenerySubtype,&subtype);
    switch(*pmVar2) {
    case '\0':
      readUINT32(_type);
      break;
    case '\x01':
      readUINT32(_type);
      readUINT32(_type);
      break;
    case '\x02':
      readUINT32(_type);
      readUINT32(_type);
      break;
    case '\x03':
      readUINT32(_type);
      readUINT32(_type);
      break;
    case '\x04':
      readUINT32(_type);
      readUINT32(_type);
      break;
    case '\x05':
    }
    break;
  case 3:
    break;
  case 4:
    break;
  case 5:
    if (subtype != 0xc) {
      if (subtype - 0x10 < 8) {
        readUINT32(_type);
        readUINT32(_type);
        readUINT32(_type);
        readUINT32(_type);
      }
      else {
        readUINT32(_type);
        readUINT32(_type);
        readUINT32(_type);
        readUINT32(_type);
      }
    }
  }
  if (0 < iVar1) {
    for (local_2c = 0; local_2c != iVar1; local_2c = local_2c + 1) {
      readUINT32(_type);
      readObject(_type);
    }
  }
  return;
}

Assistant:

void readObject(std::ifstream& stream)
{
    readUINT32(stream); // unknown 0
    readINT32(stream);  // position
    readUINT32(stream); // unknown 1
    readUINT32(stream); // unknown 2
    readUINT32(stream); // unknown 3
    readUINT32(stream); // unknown 4
    readUINT32(stream); // frame number
    readUINT32(stream); // orientation
    readUINT32(stream); // FID
    readUINT32(stream); // FLAGS
    readUINT32(stream); // elevation
    uint32_t PID = readUINT32(stream);

    uint32_t type = (PID & 0xFF000000) >> 24;
    uint32_t id  = PID & 0x00FFFFFF;

    readUINT32(stream); // unknown 5
    readUINT32(stream); // unknown 6
    readUINT32(stream); // unknown 7
    readUINT32(stream); // unknown 8
    readUINT32(stream); // SID
    readUINT32(stream); // SID
    int32_t inventorySize = readINT32(stream);
    readUINT32(stream); // unknown 9
    readUINT32(stream); // unknown 10
    readUINT32(stream); // unknown 11

    switch (type)
    {
        case 0: // items
        {
            uint32_t subtype = itemSubtype.at(id);
            switch (subtype)
            {
                case 0: // armor
                    break;
                case 1: // container
                    break;
                case 2: // drug
                    break;
                case 3: // weapon
                    readUINT32(stream);
                    readUINT32(stream);
                    break;
                case 4: // ammo
                    readUINT32(stream);
                    break;
                case 5: // misc
                    readUINT32(stream);
                    break;
                case 6: // key
                    readUINT32(stream);
                    break;
            }
            break;
        }
        case 1: // critters:
            readUINT32(stream);
            readUINT32(stream);
            readUINT32(stream);
            readUINT32(stream);
            readUINT32(stream);
            readUINT32(stream);
            readUINT32(stream);
            readUINT32(stream);
            readUINT32(stream);
            readUINT32(stream);
            break;
        case 2: // scenery
        {
            uint32_t subtype = scenerySubtype.at(id);
            switch (subtype)
            {
                case 0: // door
                    readUINT32(stream);
                    break;
                case 1: // stairs
                    readUINT32(stream);
                    readUINT32(stream);
                    break;
                case 2: // elevator
                    readUINT32(stream);
                    readUINT32(stream);
                    break;
                case 3: // ladder bottom
                    readUINT32(stream);
                    readUINT32(stream);
                    break;
                case 4: // ladder top
                    readUINT32(stream);
                    readUINT32(stream);
                    break;
                case 5: // generic
                    break;
            }
            break;
        }
        case 3:
            break;
        case 4:
            break;
        case 5:
        {
            switch(id)
            {
                case 12:
                    break;
                // Exit Grids
                case 16:
                case 17:
                case 18:
                case 19:
                case 20:
                case 21:
                case 22:
                case 23:
                    readUINT32(stream);
                    readUINT32(stream);
                    readUINT32(stream);
                    readUINT32(stream);
                    break;
                default:
                    readUINT32(stream);
                    readUINT32(stream);
                    readUINT32(stream);
                    readUINT32(stream);
                    break;
            }
            break;
        }
    }

    if (inventorySize > 0)
    {
        for (unsigned i = 0; i != inventorySize; ++i)
        {
            readUINT32(stream); // ammount
            readObject(stream);
        }
    }
}